

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void error<bool,bool>(char *fmtstr,bool *args,bool *args_1)

{
  String local_60;
  String local_40;
  bool *local_20;
  bool *args_local_1;
  bool *args_local;
  char *fmtstr_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (bool *)fmtstr;
  String::String(&local_60,fmtstr);
  format<bool,bool>(&local_40,&local_60,args_local_1,local_20);
  error(&local_40);
  String::~String(&local_40);
  String::~String(&local_60);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}